

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void AccessibilityCheckNode(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *local_20;
  Node *content;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_BODY)) {
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_HEAD)) {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_A)) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_IMG))
        {
          if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
             (node->tag->id != TidyTag_MAP)) {
            if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
               (node->tag->id != TidyTag_AREA)) {
              if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                 (node->tag->id != TidyTag_APPLET)) {
                if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                   (node->tag->id != TidyTag_OBJECT)) {
                  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                     (node->tag->id != TidyTag_FRAME)) {
                    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                       (node->tag->id != TidyTag_IFRAME)) {
                      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                         (node->tag->id != TidyTag_SCRIPT)) {
                        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                           (node->tag->id != TidyTag_TABLE)) {
                          if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                              (node->tag->id != TidyTag_PRE)) &&
                             (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
                              (node->tag->id != TidyTag_XMP)))) {
                            if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                               (node->tag->id != TidyTag_LABEL)) {
                              if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                                 (node->tag->id != TidyTag_INPUT)) {
                                if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                                   (node->tag->id != TidyTag_FRAMESET)) {
                                  BVar1 = prvTidynodeIsHeader(node);
                                  if (BVar1 == no) {
                                    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                                       (node->tag->id != TidyTag_P)) {
                                      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                                         (node->tag->id != TidyTag_HTML)) {
                                        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                                           (node->tag->id != TidyTag_BLINK)) {
                                          if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0))
                                             || (node->tag->id != TidyTag_MARQUEE)) {
                                            if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)
                                                ) || (node->tag->id != TidyTag_LINK)) {
                                              if (((node == (Node *)0x0) ||
                                                  (node->tag == (Dict *)0x0)) ||
                                                 (node->tag->id != TidyTag_STYLE)) {
                                                if (((node == (Node *)0x0) ||
                                                    (node->tag == (Dict *)0x0)) ||
                                                   (node->tag->id != TidyTag_EMBED)) {
                                                  if ((((((node == (Node *)0x0) ||
                                                         (node->tag == (Dict *)0x0)) ||
                                                        (node->tag->id != TidyTag_BASEFONT)) &&
                                                       (((node == (Node *)0x0 ||
                                                         (node->tag == (Dict *)0x0)) ||
                                                        (node->tag->id != TidyTag_CENTER)))) &&
                                                      (((node == (Node *)0x0 ||
                                                        (node->tag == (Dict *)0x0)) ||
                                                       (node->tag->id != TidyTag_ISINDEX)))) &&
                                                     ((((((((node == (Node *)0x0 ||
                                                            (node->tag == (Dict *)0x0)) ||
                                                           (node->tag->id != TidyTag_U)) &&
                                                          (((node == (Node *)0x0 ||
                                                            (node->tag == (Dict *)0x0)) ||
                                                           (node->tag->id != TidyTag_FONT)))) &&
                                                         (((node == (Node *)0x0 ||
                                                           (node->tag == (Dict *)0x0)) ||
                                                          (node->tag->id != TidyTag_DIR)))) &&
                                                        (((node == (Node *)0x0 ||
                                                          (node->tag == (Dict *)0x0)) ||
                                                         (node->tag->id != TidyTag_S)))) &&
                                                       (((node == (Node *)0x0 ||
                                                         (node->tag == (Dict *)0x0)) ||
                                                        (node->tag->id != TidyTag_STRIKE)))) &&
                                                      (((node == (Node *)0x0 ||
                                                        (node->tag == (Dict *)0x0)) ||
                                                       (node->tag->id != TidyTag_MENU)))))) {
                                                    if (((node == (Node *)0x0) ||
                                                        (node->tag == (Dict *)0x0)) ||
                                                       (node->tag->id != TidyTag_TH)) {
                                                      if ((((node != (Node *)0x0) &&
                                                           (node->tag != (Dict *)0x0)) &&
                                                          (node->tag->id == TidyTag_LI)) ||
                                                         ((((node != (Node *)0x0 &&
                                                            (node->tag != (Dict *)0x0)) &&
                                                           (node->tag->id == TidyTag_OL)) ||
                                                          (((node != (Node *)0x0 &&
                                                            (node->tag != (Dict *)0x0)) &&
                                                           (node->tag->id == TidyTag_UL)))))) {
                                                        CheckListUsage(doc,node);
                                                      }
                                                    }
                                                    else {
                                                      CheckTH(doc,node);
                                                    }
                                                  }
                                                  else {
                                                    CheckDeprecated(doc,node);
                                                  }
                                                }
                                                else {
                                                  CheckEmbed(doc,node);
                                                  ProgrammaticObjects(doc,node);
                                                  AccessibleCompatible(doc,node);
                                                  CheckFlicker(doc,node);
                                                }
                                              }
                                              else {
                                                CheckColorContrast(doc,node);
                                                CheckStyle(doc,node);
                                              }
                                            }
                                            else {
                                              CheckLink(doc,node);
                                            }
                                          }
                                          else {
                                            CheckMarquee(doc,node);
                                          }
                                        }
                                        else {
                                          CheckBlink(doc,node);
                                        }
                                      }
                                      else {
                                        CheckHTMLAccess(doc,node);
                                      }
                                    }
                                    else {
                                      CheckParagraphHeader(doc,node);
                                    }
                                  }
                                  else {
                                    CheckHeaderNesting(doc,node);
                                  }
                                }
                                else {
                                  CheckFrameSet(doc,node);
                                }
                              }
                              else {
                                CheckColorAvailable(doc,node);
                                CheckInputLabel(doc,node);
                                CheckInputAttributes(doc,node);
                              }
                            }
                            else {
                              CheckLabel(doc,node);
                            }
                          }
                          else {
                            CheckASCII(doc,node);
                          }
                        }
                        else {
                          CheckColorContrast(doc,node);
                          CheckTable(doc,node);
                        }
                      }
                      else {
                        DynamicContent(doc,node);
                        ProgrammaticObjects(doc,node);
                        AccessibleCompatible(doc,node);
                        CheckFlicker(doc,node);
                        CheckColorAvailable(doc,node);
                        CheckScriptAcc(doc,node);
                      }
                    }
                    else {
                      CheckIFrame(doc,node);
                    }
                  }
                  else {
                    CheckFrame(doc,node);
                  }
                }
                else {
                  ProgrammaticObjects(doc,node);
                  DynamicContent(doc,node);
                  AccessibleCompatible(doc,node);
                  CheckFlicker(doc,node);
                  CheckColorAvailable(doc,node);
                  CheckObject(doc,node);
                }
              }
              else {
                CheckDeprecated(doc,node);
                ProgrammaticObjects(doc,node);
                DynamicContent(doc,node);
                AccessibleCompatible(doc,node);
                CheckFlicker(doc,node);
                CheckColorAvailable(doc,node);
                CheckApplet(doc,node);
              }
            }
            else {
              CheckArea(doc,node);
            }
          }
          else {
            CheckMapLinks(doc,node);
          }
        }
        else {
          CheckFlicker(doc,node);
          CheckColorAvailable(doc,node);
          CheckImage(doc,node);
        }
      }
      else {
        CheckAnchorAccess(doc,node);
      }
    }
    else {
      BVar1 = CheckMetaData(doc,node,no);
      if (BVar1 == no) {
        MetaDataPresent(doc,node);
      }
    }
  }
  else {
    CheckColorContrast(doc,node);
  }
  for (local_20 = node->content; local_20 != (Node *)0x0; local_20 = local_20->next) {
    AccessibilityCheckNode(doc,local_20);
  }
  return;
}

Assistant:

static void AccessibilityCheckNode( TidyDocImpl* doc, Node* node )
{
    Node* content;
    
    /* Check BODY for color contrast */
    if ( nodeIsBODY(node) )
    {
        CheckColorContrast( doc, node );
    }

    /* Checks document for MetaData */
    else if ( nodeIsHEAD(node) )
    {
        if ( !CheckMetaData( doc, node, no ) )
          MetaDataPresent( doc, node );
    }
    
    /* Check the ANCHOR tag */
    else if ( nodeIsA(node) )
    {
        CheckAnchorAccess( doc, node );
    }

    /* Check the IMAGE tag */
    else if ( nodeIsIMG(node) )
    {
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckImage( doc, node );
    }

        /* Checks MAP for client-side text links */
    else if ( nodeIsMAP(node) )
    {
        CheckMapLinks( doc, node );
    }

    /* Check the AREA tag */
    else if ( nodeIsAREA(node) )
    {
        CheckArea( doc, node );
    }

    /* Check the APPLET tag */
    else if ( nodeIsAPPLET(node) )
    {
        CheckDeprecated( doc, node );
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckApplet(doc, node );
    }
    
    /* Check the OBJECT tag */
    else if ( nodeIsOBJECT(node) )
    {
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckObject( doc, node );
    }
    
    /* Check the FRAME tag */
    else if ( nodeIsFRAME(node) )
    {
        CheckFrame( doc, node );
    }
    
    /* Check the IFRAME tag */
    else if ( nodeIsIFRAME(node) )
    {
        CheckIFrame( doc, node );
    }
    
    /* Check the SCRIPT tag */
    else if ( nodeIsSCRIPT(node) )
    {
        DynamicContent( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckScriptAcc( doc, node );
    }

    /* Check the TABLE tag */
    else if ( nodeIsTABLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckTable( doc, node );
    }

    /* Check the PRE for ASCII art */
    else if ( nodeIsPRE(node) || nodeIsXMP(node) )
    {
        CheckASCII( doc, node );
    }

    /* Check the LABEL tag */
    else if ( nodeIsLABEL(node) )
    {
        CheckLabel( doc, node );
    }

    /* Check INPUT tag for validity */
    else if ( nodeIsINPUT(node) )
    {
        CheckColorAvailable( doc, node );
        CheckInputLabel( doc, node );
        CheckInputAttributes( doc, node );
    }

    /* Checks FRAMESET element for NOFRAME section */
    else if ( nodeIsFRAMESET(node) )
    {
        CheckFrameSet( doc, node );
    }
    
    /* Checks for header elements for valid header increase */
    else if ( TY_(nodeIsHeader)(node) )
    {
        CheckHeaderNesting( doc, node );
    }

    /* Checks P element to ensure that it is not a header */
    else if ( nodeIsP(node) )
    {
        CheckParagraphHeader( doc, node );
    }

    /* Checks HTML elemnt for valid 'LANG' */
    else if ( nodeIsHTML(node) )
    {
        CheckHTMLAccess( doc, node );
    }

    /* Checks BLINK for any blinking text */
    else if ( nodeIsBLINK(node) )
    {
        CheckBlink( doc, node );
    }

    /* Checks MARQUEE for any MARQUEE text */
    else if ( nodeIsMARQUEE(node) )
    {
        CheckMarquee( doc, node );
    }

    /* Checks LINK for 'REL' attribute */
    else if ( nodeIsLINK(node) )
    {
        CheckLink( doc, node );
    }

    /* Checks to see if STYLE is used */
    else if ( nodeIsSTYLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckStyle( doc, node );
    }

    /* Checks to see if EMBED is used */
    else if ( nodeIsEMBED(node) )
    {
        CheckEmbed( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
    }

    /* Deprecated HTML if the following tags are found in the document */
    else if ( nodeIsBASEFONT(node) ||
              nodeIsCENTER(node)   ||
              nodeIsISINDEX(node)  ||
              nodeIsU(node)        ||
              nodeIsFONT(node)     ||
              nodeIsDIR(node)      ||
              nodeIsS(node)        ||
              nodeIsSTRIKE(node)   ||
              nodeIsMENU(node) )
    {
        CheckDeprecated( doc, node );
    }

    /* Checks for 'ABBR' attribute if needed */
    else if ( nodeIsTH(node) )
    {
        CheckTH( doc, node );
    }

    /* Ensures that lists are properly used */
    else if ( nodeIsLI(node) || nodeIsOL(node) || nodeIsUL(node) )
    {
        CheckListUsage( doc, node );
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
    {
        AccessibilityCheckNode( doc, content );
    }
}